

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O0

void CVmObjBigNum::div_by_2e32(char *ext,uint32_t *remp)

{
  bool bVar1;
  uint dig_00;
  undefined4 uVar2;
  size_t sVar3;
  ulong uVar4;
  char *pcVar5;
  char *ext_00;
  undefined4 *in_RSI;
  char *in_RDI;
  int quo;
  ulong dig;
  ulong hi;
  ulong rem3;
  ulong rem1;
  int exp;
  unsigned_long rem;
  size_t prec;
  int sig;
  size_t out_idx;
  size_t in_idx;
  uint local_68;
  char *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffb0;
  int local_3c;
  ulong local_38;
  ulong local_20;
  ulong local_18;
  
  sVar3 = get_prec((char *)0x2c19a8);
  local_3c = get_exp((char *)0x2c19c0);
  if (local_3c < 1) {
    *in_RSI = 0;
    set_zero(in_stack_ffffffffffffffa0);
  }
  else {
    local_38 = 0;
    bVar1 = false;
    local_20 = 0;
    local_18 = 0;
    while (uVar2 = (undefined4)local_38, local_20 < sVar3) {
      uVar4 = (local_38 & 0x7fffffff) * 2;
      in_stack_ffffffffffffffb0 = (char *)((local_38 & 0x1fffffff) * 8);
      pcVar5 = in_stack_ffffffffffffffb0 + uVar4;
      if (local_18 < sVar3) {
        local_68 = get_dig(in_RDI,local_18);
      }
      else {
        local_68 = 0;
      }
      ext_00 = (char *)(ulong)local_68;
      dig_00 = (uint)((char *)(0xffffffff - ((ulong)pcVar5 & 0xffffffff)) < ext_00) +
               (int)(local_38 >> 0x1f) + (int)(local_38 >> 0x1d) +
               (uint)((local_38 & 0x1fffffff) * -8 + 0xffffffff < uVar4);
      local_38 = (ulong)(ext_00 + ((ulong)pcVar5 & 0xffffffff)) & 0xffffffff;
      uVar2 = SUB84(ext_00 + ((ulong)pcVar5 & 0xffffffff),0);
      if (dig_00 != 0) {
        bVar1 = true;
      }
      if (bVar1) {
        uVar4 = local_20 + 1;
        set_dig(in_RDI,local_20,dig_00);
        local_20 = uVar4;
        if ((int)uVar4 == local_3c) break;
      }
      else {
        local_3c = local_3c + -1;
        set_exp(ext_00,dig_00);
        if (local_3c == 0) break;
      }
      if ((local_38 == 0) && (sVar3 <= local_18)) {
        if (!bVar1) {
          set_zero(ext_00);
          local_20 = sVar3;
        }
        break;
      }
      local_18 = local_18 + 1;
    }
    for (; local_38._0_4_ = uVar2, local_20 < sVar3; local_20 = local_20 + 1) {
      set_dig(in_RDI,local_20,0);
      uVar2 = (undefined4)local_38;
    }
    normalize(in_stack_ffffffffffffffb0);
    *in_RSI = (undefined4)local_38;
  }
  return;
}

Assistant:

void CVmObjBigNum::div_by_2e32(char *ext, uint32_t *remp)
{
    size_t in_idx;
    size_t out_idx;
    int sig;
    size_t prec = get_prec(ext);
    unsigned long rem = 0;
    int exp = get_exp(ext);

    /* if it's entirely fractional, the result is 0 with remainder 0 */
    if (exp <= 0)
    {
        *remp = 0;
        set_zero(ext);
        return;
    }

    /* start at the most significant digit and work down */
    for (rem = 0, sig = FALSE, in_idx = out_idx = 0 ;
         out_idx < prec ; ++in_idx)
    {
        /* 
         *   Multiply the remainder by 10.  10 == (2+8), so this is the sum
         *   of rem<<1 and rem<<3.  This is handy because it makes it
         *   relatively easy to calculate the overflow from the 32-bit
         *   accumulator on 32-bit platforms: the overflow is the sum of the
         *   high bit and the high three bits, plus the carry from the low
         *   part.  The low part has a carry of 1 if rem<<1 + rem<<3 exceeds
         *   0xffffffff, which we can calculate in 32 bits as rem<<1 >
         *   0xffffffff - rem<<3.  
         */
        ulong rem1 = (rem << 1) & 0xffffffff;
        ulong rem3 = (rem << 3) & 0xffffffff;
        ulong hi = ((rem >> 31) & 0x00000001)
                   + ((rem >> 29) & 0x00000007)
                   + (rem1 > 0xffffffff - rem3 ? 1 : 0);
        rem = (rem1 + rem3) & 0xffffffff;

        /* 
         *   Add the current digit into the remainder.  We again need to
         *   carry the overflow into the high part. 
         */
        ulong dig = (in_idx < prec ? get_dig(ext, in_idx) : 0);
        hi += dig > 0xffffffff - rem ? 1 : 0;
        rem = (rem + dig) & 0xffffffff;

        /*
         *   We now have the quotient of rem/2^32 in 'hi', and the remainder
         *   in 'rem'.
         */
        int quo = (int)hi;

        /* if the quotient is non-zero, we've found a significant digit */
        if (quo != 0)
            sig = TRUE;

        /* 
         *   if we've found a significant digit, store it; otherwise, just
         *   reduce the exponent to account for an implied leading zero that
         *   we won't actually store 
         */
        if (sig)
        {
            /* store the digit */
            set_dig(ext, out_idx++, quo);

            /* 
             *   if we've reached the decimal place, stop here, since we're
             *   doing integer division 
             */
            if ((int)out_idx == exp)
                break;
        }
        else
        {
            /* all leading zeros so far - adjust the exponent */
            set_exp(ext, --exp);

            /* if this leaves us with a fractional result, we're done */
            if (exp == 0)
                break;
        }

        /* 
         *   If we've reached the last input digit and the remainder is zero,
         *   we're done - fill out the rest of the number with trailing zeros
         *   and stop looping.  If we've reached the decimal point in the
         *   output, stop here, since we're doing an integer division.  
         */
        if (rem == 0 && in_idx >= prec)
        {
            /* if we don't have any significant digits, we have a zero */
            if (!sig)
            {
                set_zero(ext);
                out_idx = prec;
            }

            /* we have our result */
            break;
        }
    }

    /* fill out the rest of the number with zeros */
    for ( ; out_idx < prec ; ++out_idx)
        set_dig(ext, out_idx, 0);

    /* normalize the result */
    normalize(ext);

    /* pass back the remainder */
    *remp = rem;
}